

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Pop * __thiscall MixedArena::alloc<wasm::Pop>(MixedArena *this)

{
  Pop *pPVar1;
  
  pPVar1 = (Pop *)allocSpace(this,0x10,8);
  (pPVar1->super_SpecificExpression<(wasm::Expression::Id)40>).super_Expression._id = PopId;
  (pPVar1->super_SpecificExpression<(wasm::Expression::Id)40>).super_Expression.type.id = 0;
  return pPVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }